

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

TracedDictionary * __thiscall perfetto::TracedValue::WriteDictionary(TracedValue *this)

{
  EventContext *pEVar1;
  TracedDictionary *in_RDI;
  
  pEVar1 = this->event_context_;
  in_RDI->message_ = &this->annotation_->super_Message;
  in_RDI->field_id_ = 0xb;
  in_RDI->event_context_ = pEVar1;
  return in_RDI;
}

Assistant:

TracedDictionary TracedValue::WriteDictionary() && {
  // Note: this passes |checked_scope_.is_active_| bit to the parent to be
  // picked up later by the new TracedDictionary.
  PERFETTO_DCHECK(checked_scope_.is_active());
  checked_scope_.Reset();

  PERFETTO_DCHECK(!annotation_->is_finalized());
  return TracedDictionary(annotation_,
                          protos::pbzero::DebugAnnotation::kDictEntries,
                          event_context_, checked_scope_.parent_scope());
}